

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euc_jp.c
# Opt level: O1

int is_valid_mbc_string(OnigUChar *p,OnigUChar *end)

{
  OnigUChar OVar1;
  byte bVar2;
  long lVar3;
  
  if (p < end) {
    do {
      OVar1 = *p;
      lVar3 = 1;
      if ((char)OVar1 < '\0') {
        if (OVar1 == 0x80) {
          return 0;
        }
        if (OVar1 == 0xff) {
          return 0;
        }
        if (end <= p + 1) {
          return 0;
        }
        bVar2 = p[1];
        if (bVar2 < 0x40) {
          if ((byte)(bVar2 - 0x3a) < 0xf6) {
            return 0;
          }
          if (end <= p + 2) {
            return 0;
          }
          if ((byte)(p[2] + 1) < 0x82) {
            return 0;
          }
          if (end <= p + 3) {
            return 0;
          }
          lVar3 = 4;
          if ((byte)(p[3] - 0x3a) < 0xf6) {
            return 0;
          }
        }
        else {
          lVar3 = 2;
          if ((bVar2 | 0x80) == 0xff) {
            return 0;
          }
        }
      }
      p = p + lVar3;
    } while (p < end);
  }
  return 1;
}

Assistant:

static int
is_valid_mbc_string(const UChar* p, const UChar* end)
{
  while (p < end) {
    if (*p < 0x80) {
      p++;
    }
    else if (*p > 0xa0) {
      if (*p == 0xff) return FALSE;
      p++;
      if (p >= end) return FALSE;
      if (*p < 0xa1 || *p == 0xff) return FALSE;
      p++;
    }
    else if (*p == 0x8e) {
      p++;
      if (p >= end) return FALSE;
      if (*p < 0xa1 || *p > 0xdf) return FALSE;
      p++;
    }
    else if (*p == 0x8f) {
      p++;
      if (p >= end) return FALSE;
      if (*p < 0xa1 || *p == 0xff) return FALSE;
      p++;
      if (p >= end) return FALSE;
      if (*p < 0xa1 || *p == 0xff) return FALSE;
      p++;
    }
    else
      return FALSE;
  }

  return TRUE;
}